

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
          (type_caster_generic *this,handle src,bool convert)

{
  byte bVar1;
  PyTypeObject *t;
  undefined8 *puVar2;
  pointer pp_Var3;
  pointer pp_Var4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var8;
  type_info *ptVar9;
  internals *this_00;
  iterator iVar10;
  undefined7 in_register_00000011;
  undefined4 uVar11;
  _func_bool__object_ptr_void_ptr_ptr **converter;
  pointer pp_Var12;
  pointer pp_Var13;
  undefined8 *puVar14;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar15;
  object temp;
  undefined4 in_stack_ffffffffffffffa8;
  value_and_holder local_50;
  
  if (src.m_ptr == (PyObject *)0x0) {
LAB_001176c9:
    bVar5 = false;
  }
  else {
    if (this->typeinfo == (type_info *)0x0) {
      bVar5 = try_load_foreign_module_local(this,src);
      return bVar5;
    }
    if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
      if (!convert) goto LAB_001176c9;
      this->value = (void *)0x0;
    }
    else {
      t = (src.m_ptr)->ob_type;
      if (t != this->typeinfo->type) {
        iVar6 = PyType_IsSubtype(t);
        if (iVar6 == 0) goto LAB_0011773a;
        uVar11 = (undefined4)CONCAT71(in_register_00000011,convert);
        pVar15 = all_type_info_get_cache((PyTypeObject *)CONCAT44(uVar11,in_stack_ffffffffffffffa8))
        ;
        _Var8 = pVar15.first.
                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                ._M_cur;
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          all_type_info_populate
                    (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                        *)((long)_Var8.
                                 super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                 ._M_cur + 0x10));
        }
        convert = SUB41(uVar11,0);
        bVar1 = this->typeinfo->field_0x90;
        puVar14 = *(undefined8 **)
                   ((long)_Var8.
                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                          ._M_cur + 0x10);
        puVar2 = *(undefined8 **)
                  ((long)_Var8.
                         super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                         ._M_cur + 0x18);
        if ((long)puVar2 - (long)puVar14 == 8) {
          if (((bVar1 & 1) != 0) || (*(PyTypeObject **)*puVar14 == this->typeinfo->type))
          goto LAB_0011767b;
        }
        else if (puVar14 != puVar2 && 8 < (ulong)((long)puVar2 - (long)puVar14)) {
          do {
            ptVar9 = (type_info *)*puVar14;
            if ((bVar1 & 1) == 0) {
              uVar7 = (uint)(ptVar9->type == this->typeinfo->type);
            }
            else {
              uVar7 = PyType_IsSubtype();
            }
            convert = SUB41(uVar11,0);
            if (uVar7 != 0) {
              instance::get_value_and_holder(&local_50,(instance *)src.m_ptr,ptVar9,true);
              goto LAB_00117698;
            }
            puVar14 = puVar14 + 1;
          } while (puVar14 != puVar2);
        }
        bVar5 = try_implicit_casts(this,src,convert);
        if (bVar5) {
          return true;
        }
LAB_0011773a:
        ptVar9 = this->typeinfo;
        if (convert != false) {
          pp_Var12 = (ptVar9->implicit_conversions).
                     super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pp_Var3 = (ptVar9->implicit_conversions).
                    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pp_Var12 != pp_Var3) {
            do {
              local_50.inst = (instance *)(**pp_Var12)(src.m_ptr,this->typeinfo->type);
              bVar5 = load_impl<pybind11::detail::type_caster_generic>
                                (this,(handle)local_50.inst,false);
              if (bVar5) {
                loader_life_support::add_patient((handle)local_50.inst);
                object::~object((object *)&local_50);
                goto LAB_001176c5;
              }
              object::~object((object *)&local_50);
              pp_Var12 = pp_Var12 + 1;
            } while (pp_Var12 != pp_Var3);
            ptVar9 = this->typeinfo;
          }
          pp_Var13 = (ptVar9->direct_conversions->
                     super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          pp_Var4 = (ptVar9->direct_conversions->
                    super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          if (pp_Var13 != pp_Var4) {
            do {
              bVar5 = (**pp_Var13)(src.m_ptr,&this->value);
              if (bVar5) goto LAB_001176c5;
              pp_Var13 = pp_Var13 + 1;
            } while (pp_Var13 != pp_Var4);
            ptVar9 = this->typeinfo;
          }
        }
        if ((ptVar9->field_0x90 & 8) != 0) {
          local_50.inst = (instance *)ptVar9->cpptype;
          this_00 = get_internals();
          iVar10 = std::
                   _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)this_00,(key_type *)&local_50);
          if ((iVar10.
               super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
               ._M_cur != (__node_type *)0x0) &&
             (*(type_info **)
               ((long)iVar10.
                      super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                      ._M_cur + 0x10) != (type_info *)0x0)) {
            this->typeinfo =
                 *(type_info **)
                  ((long)iVar10.
                         super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                         ._M_cur + 0x10);
            bVar5 = load_impl<pybind11::detail::type_caster_generic>(this,src,false);
            return bVar5;
          }
        }
        bVar5 = try_load_foreign_module_local(this,src);
        return bVar5;
      }
LAB_0011767b:
      instance::get_value_and_holder(&local_50,(instance *)src.m_ptr,(type_info *)0x0,true);
LAB_00117698:
      load_value(this,&local_50);
    }
LAB_001176c5:
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

PYBIND11_NOINLINE inline handle get_type_handle(const std::type_info &tp, bool throw_if_missing) {
    detail::type_info *type_info = get_type_info(tp, throw_if_missing);
    return handle(type_info ? ((PyObject *) type_info->type) : nullptr);
}